

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O2

Offset<reflection::Field>
reflection::CreateField
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,Offset<reflection::Type> type,
          uint16_t id,uint16_t offset,int64_t default_integer,double default_real,bool deprecated,
          bool required,bool key,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,bool optional,uint16_t padding,bool offset64)

{
  Offset<reflection::Field> OVar1;
  FieldBuilder local_40;
  
  local_40.fbb_ = _fbb;
  local_40.start_ = flatbuffers::FlatBufferBuilderImpl<false>::StartTable(_fbb);
  FieldBuilder::add_default_real(&local_40,default_real);
  FieldBuilder::add_default_integer(&local_40,default_integer);
  FieldBuilder::add_documentation(&local_40,documentation);
  FieldBuilder::add_attributes(&local_40,attributes);
  FieldBuilder::add_type(&local_40,type);
  FieldBuilder::add_name(&local_40,name);
  FieldBuilder::add_padding(&local_40,padding);
  FieldBuilder::add_offset(&local_40,offset);
  FieldBuilder::add_id(&local_40,id);
  FieldBuilder::add_offset64(&local_40,offset64);
  FieldBuilder::add_optional(&local_40,optional);
  FieldBuilder::add_key(&local_40,key);
  FieldBuilder::add_required(&local_40,required);
  FieldBuilder::add_deprecated(&local_40,deprecated);
  OVar1 = FieldBuilder::Finish(&local_40);
  return (Offset<reflection::Field>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Field> CreateField(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<reflection::Type> type = 0,
    uint16_t id = 0,
    uint16_t offset = 0,
    int64_t default_integer = 0,
    double default_real = 0.0,
    bool deprecated = false,
    bool required = false,
    bool key = false,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    bool optional = false,
    uint16_t padding = 0,
    bool offset64 = false) {
  FieldBuilder builder_(_fbb);
  builder_.add_default_real(default_real);
  builder_.add_default_integer(default_integer);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_type(type);
  builder_.add_name(name);
  builder_.add_padding(padding);
  builder_.add_offset(offset);
  builder_.add_id(id);
  builder_.add_offset64(offset64);
  builder_.add_optional(optional);
  builder_.add_key(key);
  builder_.add_required(required);
  builder_.add_deprecated(deprecated);
  return builder_.Finish();
}